

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O1

void Imf_2_5::RgbaYca::decimateChromaHoriz(int n,Rgba *ycaIn,Rgba *ycaOut)

{
  short sVar1;
  unsigned_short uVar2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  
  if (0 < n) {
    iVar4 = 0xd;
    if (0xd < n + 0xc) {
      iVar4 = n + 0xc;
    }
    uVar3 = 0;
    do {
      if ((uVar3 & 1) == 0) {
        fVar5 = *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x1a].r._h * 4) * 0.001064 +
                *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x18].r._h * 4) * -0.003771
                + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x16].r._h * 4) * 0.009801
                  + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x14].r._h * 4) *
                    -0.021586 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x12].r._h * 4) *
                    0.043978 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x10].r._h * 4) *
                    -0.093067 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xe].r._h * 4) *
                    0.313659 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xd].r._h * 4) *
                    0.499846 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xc].r._h * 4) *
                    0.313659 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 10].r._h * 4) *
                    -0.093067 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 8].r._h * 4) * 0.043978
                    + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 6].r._h * 4) *
                      -0.021586 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 4].r._h * 4) *
                      0.009801 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3].r._h * 4) * 0.001064 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 2].r._h * 4) *
                      -0.003771;
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar5 >> 0x17) * 2);
          if (sVar1 == 0) {
            uVar2 = half::convert((int)fVar5);
          }
          else {
            uVar2 = sVar1 + (short)(((uint)fVar5 & 0x7fffff) + 0xfff +
                                    (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          uVar2 = (unsigned_short)((uint)fVar5 >> 0x10);
        }
        ycaOut[uVar3].r._h = uVar2;
        fVar5 = *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x1a].b._h * 4) * 0.001064 +
                *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x18].b._h * 4) * -0.003771
                + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x16].b._h * 4) * 0.009801
                  + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x14].b._h * 4) *
                    -0.021586 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x12].b._h * 4) *
                    0.043978 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0x10].b._h * 4) *
                    -0.093067 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xe].b._h * 4) *
                    0.313659 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xd].b._h * 4) *
                    0.499846 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 0xc].b._h * 4) *
                    0.313659 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 10].b._h * 4) *
                    -0.093067 +
                    *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 8].b._h * 4) * 0.043978
                    + *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 6].b._h * 4) *
                      -0.021586 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 4].b._h * 4) *
                      0.009801 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3].b._h * 4) * 0.001064 +
                      *(float *)((long)&half::_toFloat + (ulong)ycaIn[uVar3 + 2].b._h * 4) *
                      -0.003771;
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar5 >> 0x17) * 2);
          if (sVar1 == 0) {
            uVar2 = half::convert((int)fVar5);
          }
          else {
            uVar2 = sVar1 + (short)(((uint)fVar5 & 0x7fffff) + 0xfff +
                                    (uint)(((uint)fVar5 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          uVar2 = (unsigned_short)((uint)fVar5 >> 0x10);
        }
        ycaOut[uVar3].b._h = uVar2;
      }
      ycaOut[uVar3].g._h = ycaIn[uVar3 + 0xd].g._h;
      ycaOut[uVar3].a._h = ycaIn[uVar3 + 0xd].a._h;
      uVar3 = uVar3 + 1;
    } while (iVar4 - 0xc != uVar3);
  }
  return;
}

Assistant:

void
decimateChromaHoriz (int n,
		     const Rgba ycaIn[/*n+N-1*/],
		     Rgba ycaOut[/*n*/])
{
    #ifdef DEBUG
	assert (ycaIn != ycaOut);
    #endif

    int begin = N2;
    int end = begin + n;

    for (int i = begin, j = 0; i < end; ++i, ++j)
    {
	if ((j & 1) == 0)
	{
	    ycaOut[j].r = ycaIn[i - 13].r *  0.001064f +
			  ycaIn[i - 11].r * -0.003771f +
			  ycaIn[i -  9].r *  0.009801f +
			  ycaIn[i -  7].r * -0.021586f +
			  ycaIn[i -  5].r *  0.043978f +
			  ycaIn[i -  3].r * -0.093067f +
			  ycaIn[i -  1].r *  0.313659f +
			  ycaIn[i     ].r *  0.499846f +
			  ycaIn[i +  1].r *  0.313659f +
			  ycaIn[i +  3].r * -0.093067f +
			  ycaIn[i +  5].r *  0.043978f +
			  ycaIn[i +  7].r * -0.021586f +
			  ycaIn[i +  9].r *  0.009801f +
			  ycaIn[i + 11].r * -0.003771f +
			  ycaIn[i + 13].r *  0.001064f;

	    ycaOut[j].b = ycaIn[i - 13].b *  0.001064f +
			  ycaIn[i - 11].b * -0.003771f +
			  ycaIn[i -  9].b *  0.009801f +
			  ycaIn[i -  7].b * -0.021586f +
			  ycaIn[i -  5].b *  0.043978f +
			  ycaIn[i -  3].b * -0.093067f +
			  ycaIn[i -  1].b *  0.313659f +
			  ycaIn[i     ].b *  0.499846f +
			  ycaIn[i +  1].b *  0.313659f +
			  ycaIn[i +  3].b * -0.093067f +
			  ycaIn[i +  5].b *  0.043978f +
			  ycaIn[i +  7].b * -0.021586f +
			  ycaIn[i +  9].b *  0.009801f +
			  ycaIn[i + 11].b * -0.003771f +
			  ycaIn[i + 13].b *  0.001064f;
	}

	ycaOut[j].g = ycaIn[i].g;
	ycaOut[j].a = ycaIn[i].a;
    }
}